

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O1

FinalizableObject * __thiscall
TTD::ThreadContextTTD::GetRuntimeContextForScriptContext(ThreadContextTTD *this,ScriptContext *ctx)

{
  Type piVar1;
  Type pSVar2;
  uint uVar3;
  FinalizableObject *pFVar4;
  Type this_00;
  uint uVar5;
  
  piVar1 = (this->m_ttdContextToExternalRefMap).buckets;
  uVar3 = 0;
  if (piVar1 != (Type)0x0) {
    uVar3 = JsUtil::
            BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((uint)((ulong)ctx >> 3) | 1,(this->m_ttdContextToExternalRefMap).bucketCount
                        ,(this->m_ttdContextToExternalRefMap).modFunctionIndex);
    uVar5 = piVar1[uVar3];
    uVar3 = 0;
    if (-1 < (int)uVar5) {
      pSVar2 = (this->m_ttdContextToExternalRefMap).entries;
      uVar3 = 0;
      do {
        if (pSVar2[uVar5].
            super_DefaultHashedEntry<Js::ScriptContext_*,_FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<Js::ScriptContext_*,_FinalizableObject_*>.
            super_ValueEntry<FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>_>
            .super_KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>.key == ctx) {
          this_00 = (this->m_ttdContextToExternalRefMap).stats;
          goto LAB_00903bcb;
        }
        uVar3 = uVar3 + 1;
        uVar5 = pSVar2[uVar5].
                super_DefaultHashedEntry<Js::ScriptContext_*,_FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<Js::ScriptContext_*,_FinalizableObject_*>.
                super_ValueEntry<FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>_>
                .super_KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>.next;
      } while (-1 < (int)uVar5);
    }
  }
  this_00 = (this->m_ttdContextToExternalRefMap).stats;
  uVar5 = 0xffffffff;
LAB_00903bcb:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  if ((int)uVar5 < 0) {
    pFVar4 = (FinalizableObject *)0x0;
  }
  else {
    pFVar4 = (this->m_ttdContextToExternalRefMap).entries[uVar5].
             super_DefaultHashedEntry<Js::ScriptContext_*,_FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<Js::ScriptContext_*,_FinalizableObject_*>.
             super_ValueEntry<FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>_>
             .super_KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>.value;
  }
  return pFVar4;
}

Assistant:

FinalizableObject* ThreadContextTTD::GetRuntimeContextForScriptContext(Js::ScriptContext* ctx)
    {
        return this->m_ttdContextToExternalRefMap.Lookup(ctx, nullptr);
    }